

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::
CreateInputTexture<unsigned_char,3,true,3u>(StorageMultisampleTest *this)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  GLenum GVar4;
  uint err;
  GLuint width;
  GLuint height;
  GLuint depth;
  GLenum format;
  GLenum type;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  uchar *data;
  Reference *this_00;
  Functions *gl;
  StorageMultisampleTest *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar6 + 0x6f8))(1,&this->m_to);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd25);
  pcVar1 = *(code **)(lVar6 + 0xb8);
  GVar4 = InputTextureTarget<3u>();
  (*pcVar1)(GVar4,this->m_to);
  err = (**(code **)(lVar6 + 0x800))();
  this_00 = (Reference *)(ulong)err;
  glu::checkError(err,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd28);
  GVar4 = Reference::InternalFormat<unsigned_char,3,true>();
  width = TestReferenceDataWidth<3u>();
  height = TestReferenceDataHeight<3u>();
  depth = TestReferenceDataDepth<3u>();
  format = Reference::Format<3,true>();
  type = Reference::Type<unsigned_char>();
  data = Reference::ReferenceData<unsigned_char,true>(this_00);
  InputTextureImage<3u>(this,GVar4,width,height,depth,format,type,data);
  pcVar1 = *(code **)(lVar6 + 0x1360);
  GVar4 = InputTextureTarget<3u>();
  (*pcVar1)(GVar4,0x2800,0x2600);
  pcVar1 = *(code **)(lVar6 + 0x1360);
  GVar4 = InputTextureTarget<3u>();
  (*pcVar1)(GVar4,0x2801,0x2600);
  dVar3 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar3,"glTexParameteri call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd31);
  return;
}

Assistant:

void StorageMultisampleTest::CreateInputTexture()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Objects creation. */
	gl.genTextures(1, &m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(InputTextureTarget<D>(), m_to);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	/* Data setup. */
	InputTextureImage<D>(InternalFormat<T, S, N>(), TestReferenceDataWidth<D>(), TestReferenceDataHeight<D>(),
						 TestReferenceDataDepth<D>(), Format<S, N>(), Type<T>(), ReferenceData<T, N>());

	/* Parameter setup. */
	gl.texParameteri(InputTextureTarget<D>(), GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	gl.texParameteri(InputTextureTarget<D>(), GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glTexParameteri call failed.");
}